

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_shutdown(Curl_easy *data,connectdata *conn,int sockindex)

{
  int iVar1;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  iVar1 = (*Curl_ssl->shut_down)(data,conn,sockindex);
  if (iVar1 == 0) {
    conn->ssl[sockindex].field_0x10 = conn->ssl[sockindex].field_0x10 & 0xfe;
    conn->ssl[sockindex].state = ssl_connection_none;
    conn->recv[sockindex] = Curl_recv_plain;
    conn->send[sockindex] = Curl_send_plain;
    data_local._4_4_ = CURLE_OK;
  }
  else {
    data_local._4_4_ = CURLE_SSL_SHUTDOWN_FAILED;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_ssl_shutdown(struct Curl_easy *data, struct connectdata *conn,
                           int sockindex)
{
  if(Curl_ssl->shut_down(data, conn, sockindex))
    return CURLE_SSL_SHUTDOWN_FAILED;

  conn->ssl[sockindex].use = FALSE; /* get back to ordinary socket usage */
  conn->ssl[sockindex].state = ssl_connection_none;

  conn->recv[sockindex] = Curl_recv_plain;
  conn->send[sockindex] = Curl_send_plain;

  return CURLE_OK;
}